

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O1

void __thiscall Scs::Server::~Server(Server *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IServer)._vptr_IServer = (_func_int **)&PTR__Server_0011cb48;
  LogWriteLine("Shutting down server.");
  LOCK();
  (this->m_shutDown)._M_base._M_i = true;
  UNLOCK();
  if ((this->m_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::_M_dispose
            (&this->m_port);
  p_Var1 = (this->m_onUpdate).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onUpdate,(_Any_data *)&this->m_onUpdate,__destroy_functor);
  }
  p_Var1 = (this->m_onReceiveData).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onReceiveData,(_Any_data *)&this->m_onReceiveData,
              __destroy_functor);
  }
  p_Var1 = (this->m_onDisconnect).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onDisconnect,(_Any_data *)&this->m_onDisconnect,
              __destroy_functor);
  }
  p_Var1 = (this->m_onConnect).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onConnect,(_Any_data *)&this->m_onConnect,__destroy_functor);
  }
  p_Var1 = (this->m_onStartListening).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onStartListening,(_Any_data *)&this->m_onStartListening,
              __destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->m_stateCondition);
  if ((this->m_thread)._M_id._M_thread == 0) {
    this_00 = (this->m_listenerSocket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
    ::_M_clear(&(this->m_connectionList).
                super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
              );
    return;
  }
  std::terminate();
}

Assistant:

Server::~Server()
{
	LogWriteLine("Shutting down server.");
    m_shutDown = true;
	if (m_thread.joinable())
		m_thread.join();
}